

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

void __thiscall
wabt::interp::RefPtr<wabt::interp::Tag>::RefPtr
          (RefPtr<wabt::interp::Tag> *this,Store *store,Ref ref)

{
  bool bVar1;
  Index IVar2;
  Object **ppOVar3;
  long lVar4;
  
  bVar1 = Store::Is<wabt::interp::Tag>(store,ref);
  if (bVar1) {
    IVar2 = Store::NewRoot(store,ref);
    this->root_index_ = IVar2;
    ppOVar3 = FreeList<wabt::interp::Object_*>::Get(&store->objects_,ref.index);
    this->obj_ = (Tag *)*ppOVar3;
    this->store_ = store;
    return;
  }
  if (ref.index == 0) {
    lVar4 = 0;
  }
  else {
    ppOVar3 = FreeList<wabt::interp::Object_*>::Get(&store->objects_,ref.index);
    lVar4 = (long)(int)(*ppOVar3)->kind_;
  }
  fprintf(_stderr,"Invalid conversion from Ref (%s) to RefPtr<%s>!\n",GetName::kNames[lVar4],"Tag");
  abort();
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}